

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_task_test.c
# Opt level: O0

void * task_worker(void *arg)

{
  int iVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  MppPort port_dst;
  MppPort port_src;
  long lStack_20;
  MPP_RET ret;
  MppTask task;
  void *pvStack_10;
  RK_S32 i;
  void *arg_local;
  
  lStack_20 = 0;
  pvStack_10 = arg;
  uVar2 = mpp_task_queue_get_port(input,1);
  uVar3 = mpp_task_queue_get_port(output,0);
  task._4_4_ = 0;
  while( true ) {
    if (9999 < task._4_4_) {
      return (void *)0x0;
    }
    iVar1 = _mpp_port_poll("task_worker",uVar2,0xffffffff);
    if ((iVar1 < 0) &&
       (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"ret >= 0","task_worker",0x72),
       (_mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    iVar1 = _mpp_port_dequeue("task_worker",uVar2,&stack0xffffffffffffffe0);
    if ((iVar1 != 0) &&
       (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"!ret","task_worker",0x75),
       (_mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if ((lStack_20 == 0) &&
       (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"task","task_worker",0x76),
       (_mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    iVar1 = _mpp_port_enqueue("task_worker",uVar2,lStack_20);
    if ((iVar1 != 0) &&
       (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"!ret","task_worker",0x79),
       (_mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    iVar1 = _mpp_port_poll("task_worker",uVar3,0xffffffff);
    if ((iVar1 < 0) &&
       (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"ret >= 0","task_worker",0x7c),
       (_mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    iVar1 = _mpp_port_dequeue("task_worker",uVar3,&stack0xffffffffffffffe0);
    if ((iVar1 != 0) &&
       (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"!ret","task_worker",0x7f),
       (_mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    if ((lStack_20 == 0) &&
       (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"task","task_worker",0x80),
       (_mpp_debug & 0x10000000) != 0)) break;
    iVar1 = _mpp_port_enqueue("task_worker",uVar3,lStack_20);
    if ((iVar1 != 0) &&
       (_mpp_log_l(2,0,"Assertion %s failed at %s:%d\n",0,"!ret","task_worker",0x83),
       (_mpp_debug & 0x10000000) != 0)) {
      abort();
    }
    task._4_4_ = task._4_4_ + 1;
  }
  abort();
}

Assistant:

void *task_worker(void *arg)
{
    RK_S32 i;
    MppTask task = NULL;
    MPP_RET ret = MPP_OK;
    MppPort port_src = mpp_task_queue_get_port(input, MPP_PORT_OUTPUT);
    MppPort port_dst = mpp_task_queue_get_port(output, MPP_PORT_INPUT);

    for (i = 0; i < MAX_TASK_LOOP; i++) {
        ret = mpp_port_poll(port_src, MPP_POLL_BLOCK);
        mpp_assert(ret >= 0);

        ret = mpp_port_dequeue(port_src, &task);
        mpp_assert(!ret);
        mpp_assert(task);

        ret = mpp_port_enqueue(port_src, task);
        mpp_assert(!ret);

        ret = mpp_port_poll(port_dst, MPP_POLL_BLOCK);
        mpp_assert(ret >= 0);

        ret = mpp_port_dequeue(port_dst, &task);
        mpp_assert(!ret);
        mpp_assert(task);

        ret = mpp_port_enqueue(port_dst, task);
        mpp_assert(!ret);
    }

    (void)arg;
    return NULL;
}